

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsConflictPool.cpp
# Opt level: O2

void __thiscall
HighsConflictPool::addReconvergenceCut
          (HighsConflictPool *this,HighsDomain *domain,
          set<HighsDomain::ConflictSet::LocalDomChg,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
          *reconvergenceFrontier,HighsDomainChange *reconvergenceDomchg)

{
  pointer puVar1;
  undefined8 *puVar2;
  _Rb_tree_color _Var3;
  pointer piVar4;
  pointer ppVar5;
  pointer ppVar6;
  int *piVar7;
  pointer pHVar8;
  pointer ppCVar9;
  _Base_ptr p_Var10;
  iterator __position;
  long lVar11;
  _Rb_tree_node_base *p_Var12;
  int iVar13;
  uint uVar14;
  int iVar15;
  pointer ppCVar16;
  HighsDomainChange *pHVar17;
  ulong extraout_XMM0_Qb;
  HighsDomainChange HVar18;
  HighsInt end;
  HighsInt start;
  int local_64;
  key_type local_60;
  _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
  *local_58;
  ulong uStack_50;
  HighsDomainChange *local_48;
  int local_34;
  
  uVar14 = (int)(reconvergenceFrontier->_M_t)._M_impl.super__Rb_tree_header._M_node_count + 1;
  local_48 = reconvergenceDomchg;
  if ((this->freeSpaces_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    local_58 = (_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                *)&this->freeSpaces_;
    local_60 = (key_type)((ulong)uVar14 | 0xffffffff00000000);
    __position = std::
                 _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                 ::lower_bound((_Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                                *)local_58,&local_60);
    if ((_Rb_tree_header *)__position._M_node !=
        &(this->freeSpaces_)._M_t._M_impl.super__Rb_tree_header) {
      _Var3 = __position._M_node[1]._M_color;
      iVar13 = *(int *)&__position._M_node[1].field_0x4;
      std::
      _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
      ::erase_abi_cxx11_(local_58,(const_iterator)__position._M_node);
      local_60.first = iVar13;
      local_64 = uVar14 + iVar13;
      iVar15 = _Var3 - uVar14;
      if (iVar15 != 0 && (int)uVar14 <= (int)_Var3) {
        local_34 = iVar15;
        std::
        _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
        ::_M_emplace_unique<int,int&>(local_58,&local_34,&local_64);
      }
      goto LAB_0028f52f;
    }
  }
  iVar13 = (int)((ulong)((long)(this->conflictEntries_).
                               super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->conflictEntries_).
                              super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 4);
  local_60.first = iVar13;
  local_64 = uVar14 + iVar13;
  std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::resize
            (&this->conflictEntries_,(long)local_64);
LAB_0028f52f:
  piVar4 = (this->deletedConflicts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((this->deletedConflicts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start == piVar4) {
    ppVar5 = (this->conflictRanges_).
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
    ppVar6 = (this->conflictRanges_).
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int&,int&>
              ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
               &this->conflictRanges_,&local_60.first,&local_64);
    std::vector<short,_std::allocator<short>_>::resize
              (&this->ages_,
               (long)(this->conflictRanges_).
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->conflictRanges_).
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&this->modification_,
               (long)(this->conflictRanges_).
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->conflictRanges_).
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3);
    iVar15 = (int)((ulong)((long)ppVar5 - (long)ppVar6) >> 3);
    lVar11 = (long)iVar15;
  }
  else {
    iVar15 = piVar4[-1];
    (this->deletedConflicts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar4 + -1;
    lVar11 = (long)iVar15;
    ppVar5 = (this->conflictRanges_).
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    ppVar5[lVar11].first = iVar13;
    ppVar5[lVar11].second = local_64;
  }
  puVar1 = (this->modification_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start + lVar11;
  *puVar1 = *puVar1 + 1;
  (this->ages_).super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_start[lVar11] = 0;
  piVar7 = (this->ageDistribution_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  *piVar7 = *piVar7 + 1;
  lVar11 = (long)local_60.first;
  HVar18 = HighsDomain::flip(domain,local_48);
  pHVar8 = (this->conflictEntries_).
           super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
           super__Vector_impl_data._M_start;
  pHVar8[lVar11].boundval = HVar18.boundval;
  pHVar8 = pHVar8 + lVar11;
  pHVar8->column = (int)HVar18._8_8_;
  pHVar8->boundtype = (int)((ulong)HVar18._8_8_ >> 0x20);
  local_48 = (HighsDomainChange *)HighsDomain::feastol(domain);
  local_58 = (_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
              *)-(double)local_48;
  uStack_50 = extraout_XMM0_Qb ^ 0x8000000000000000;
  p_Var12 = (reconvergenceFrontier->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  lVar11 = lVar11 * 0x10;
  while ((_Rb_tree_header *)p_Var12 != &(reconvergenceFrontier->_M_t)._M_impl.super__Rb_tree_header)
  {
    p_Var10 = p_Var12[1]._M_left;
    puVar2 = (undefined8 *)
             ((long)&(this->conflictEntries_).
                     super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                     _M_impl.super__Vector_impl_data._M_start[1].boundval + lVar11);
    *puVar2 = p_Var12[1]._M_parent;
    puVar2[1] = p_Var10;
    pHVar8 = (this->conflictEntries_).
             super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((domain->mipsolver->model_->integrality_).
        super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
        super__Vector_impl_data._M_start[*(int *)((long)&pHVar8[1].column + lVar11)] == kContinuous)
    {
      pHVar17 = local_48;
      if (*(int *)((long)&pHVar8[1].boundtype + lVar11) != 0) {
        pHVar17 = (HighsDomainChange *)local_58;
      }
      *(double *)((long)&pHVar8[1].boundval + lVar11) =
           (double)pHVar17 + *(double *)((long)&pHVar8[1].boundval + lVar11);
    }
    p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
    lVar11 = lVar11 + 0x10;
  }
  ppCVar9 = (this->propagationDomains).
            super__Vector_base<HighsDomain::ConflictPoolPropagation_*,_std::allocator<HighsDomain::ConflictPoolPropagation_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppCVar16 = (this->propagationDomains).
                  super__Vector_base<HighsDomain::ConflictPoolPropagation_*,_std::allocator<HighsDomain::ConflictPoolPropagation_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppCVar16 != ppCVar9;
      ppCVar16 = ppCVar16 + 1) {
    HighsDomain::ConflictPoolPropagation::conflictAdded(*ppCVar16,iVar15);
  }
  return;
}

Assistant:

void HighsConflictPool::addReconvergenceCut(
    const HighsDomain& domain,
    const std::set<HighsDomain::ConflictSet::LocalDomChg>&
        reconvergenceFrontier,
    const HighsDomainChange& reconvergenceDomchg) {
  HighsInt conflictIndex;
  HighsInt start;
  HighsInt end;
  HighsInt conflictLen = reconvergenceFrontier.size() + 1;
  std::set<std::pair<HighsInt, HighsInt>>::iterator it;
  if (freeSpaces_.empty() ||
      (it = freeSpaces_.lower_bound(
           std::make_pair(conflictLen, HighsInt{-1}))) == freeSpaces_.end()) {
    start = conflictEntries_.size();
    end = start + conflictLen;

    conflictEntries_.resize(end);
  } else {
    std::pair<HighsInt, HighsInt> freeslot = *it;
    freeSpaces_.erase(it);

    start = freeslot.second;
    end = start + conflictLen;
    // if the space was not completely occupied, we register the remainder of
    // it again in the priority queue
    if (freeslot.first > conflictLen) {
      freeSpaces_.emplace(freeslot.first - conflictLen, end);
    }
  }

  // register the range of entries for this conflict with a reused or a new
  // index
  if (deletedConflicts_.empty()) {
    conflictIndex = conflictRanges_.size();
    conflictRanges_.emplace_back(start, end);
    ages_.resize(conflictRanges_.size());
    modification_.resize(conflictRanges_.size());
  } else {
    conflictIndex = deletedConflicts_.back();
    deletedConflicts_.pop_back();
    conflictRanges_[conflictIndex].first = start;
    conflictRanges_[conflictIndex].second = end;
  }

  modification_[conflictIndex] += 1;
  ages_[conflictIndex] = 0;
  ageDistribution_[ages_[conflictIndex]] += 1;

  HighsInt i = start;
  const std::vector<HighsDomainChange>& domchgStack_ =
      domain.getDomainChangeStack();
  assert(i < end);
  conflictEntries_[i++] = domain.flip(reconvergenceDomchg);
  double feastol = domain.feastol();
  for (const HighsDomain::ConflictSet::LocalDomChg& domchg :
       reconvergenceFrontier) {
    assert(i < end);
    assert(domchg.pos >= 0);
    assert(domchg.pos < (HighsInt)domchgStack_.size());
    conflictEntries_[i] = domchg.domchg;
    if (domain.variableType(conflictEntries_[i].column) ==
        HighsVarType::kContinuous) {
      if (conflictEntries_[i].boundtype == HighsBoundType::kLower)
        conflictEntries_[i].boundval += feastol;
      else
        conflictEntries_[i].boundval -= feastol;
    }
    ++i;
  }

  for (HighsDomain::ConflictPoolPropagation* conflictProp : propagationDomains)
    conflictProp->conflictAdded(conflictIndex);
}